

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_copyWithin(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue obj_00;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue obj_01;
  JSValue JVar1;
  int iVar2;
  JSValueUnion count_00;
  int in_ECX;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSValueUnion in_RDI;
  long in_R8;
  JSValue JVar3;
  int64_t count;
  int64_t final;
  int64_t to;
  int64_t from;
  int64_t len;
  JSValue obj;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  int64_t *in_stack_ffffffffffffff68;
  JSContext *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  JSValueUnion ctx_00;
  JSValueUnion ctx_01;
  int64_t in_stack_ffffffffffffff90;
  long lVar4;
  int64_t in_stack_ffffffffffffffa0;
  long local_58;
  int in_stack_ffffffffffffffb0;
  undefined4 uStack_4c;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff4;
  JSValueUnion local_8;
  
  JVar3.tag._0_4_ = in_stack_fffffffffffffff0;
  JVar3.u = (JSValueUnion)in_RDX;
  JVar3.tag._4_4_ = in_stack_fffffffffffffff4;
  JVar3 = JS_ToObject(in_RSI,JVar3);
  ctx_00 = JVar3.u;
  local_8 = (JSValueUnion)JVar3.tag;
  obj_00.u._7_1_ = in_stack_ffffffffffffff7f;
  obj_00.u._0_7_ = in_stack_ffffffffffffff78;
  obj_00.tag = (int64_t)ctx_00.ptr;
  ctx_01 = local_8;
  iVar2 = js_get_length64(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,obj_00);
  if ((((iVar2 == 0) &&
       (val.tag = in_stack_ffffffffffffff90, val.u.ptr = ctx_01.ptr,
       iVar2 = JS_ToInt64Clamp((JSContext *)ctx_00.ptr,
                               (int64_t *)
                               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),val,
                               (int64_t)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68
                               ,in_stack_ffffffffffffffa0), iVar2 == 0)) &&
      (val_00.tag = in_stack_ffffffffffffff90, val_00.u.ptr = ctx_01.ptr,
      iVar2 = JS_ToInt64Clamp((JSContext *)ctx_00.ptr,
                              (int64_t *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),val_00,
                              (int64_t)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffffa0), iVar2 == 0)) &&
     (((lVar4 = CONCAT44(uStack_4c,in_stack_ffffffffffffffb0), in_ECX < 3 ||
       (iVar2 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x20)), iVar2 != 0)) ||
      (val_01.tag = in_stack_ffffffffffffff90, val_01.u.ptr = ctx_01.ptr,
      iVar2 = JS_ToInt64Clamp((JSContext *)ctx_00.ptr,
                              (int64_t *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),val_01,
                              (int64_t)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffffa0), iVar2 == 0)))) {
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffffa0;
    count_00 = (JSValueUnion)
               min_int64(lVar4 - local_58,
                         CONCAT44(uStack_4c,in_stack_ffffffffffffffb0) - in_stack_ffffffffffffff60);
    obj_01.tag = lVar4;
    obj_01.u.ptr = count_00.ptr;
    iVar2 = JS_CopySubArray((JSContext *)ctx_01.ptr,obj_01,(int64_t)ctx_00,
                            CONCAT17(local_58 < in_stack_ffffffffffffff60 &&
                                     in_stack_ffffffffffffff60 < local_58 + (long)count_00.ptr,
                                     in_stack_ffffffffffffff78),(int64_t)count_00,
                            in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff58 = in_RDI;
    if (iVar2 == 0) {
      uVar5 = JVar3.u._0_4_;
      in_stack_fffffffffffffff4 = JVar3.u._4_4_;
      goto LAB_001b2b66;
    }
  }
  v.tag = in_stack_ffffffffffffff60;
  v.u.float64 = in_stack_ffffffffffffff58.float64;
  JS_FreeValue(in_stack_ffffffffffffff50,v);
  uVar5 = 0;
  local_8.float64 = 2.96439387504748e-323;
LAB_001b2b66:
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = uVar5;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_array_copyWithin(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSValue obj;
    int64_t len, from, to, final, count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &to, argv[0], 0, len, len))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &from, argv[1], 0, len, len))
        goto exception;

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt64Clamp(ctx, &final, argv[2], 0, len, len))
            goto exception;
    }

    count = min_int64(final - from, len - to);

    if (JS_CopySubArray(ctx, obj, to, from, count,
                        (from < to && to < from + count) ? -1 : +1))
        goto exception;

    return obj;

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}